

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

bool __thiscall ON_ScaleValue::IsSet(ON_ScaleValue *this)

{
  bool bVar1;
  
  bVar1 = ON_LengthValue::IsSet(&this->m_left_length);
  if (bVar1) {
    bVar1 = ON_LengthValue::IsSet(&this->m_right_length);
    if (((bVar1) && (ABS(this->m_left_to_right_scale) < 1.23432101234321e+308)) &&
       (ABS(this->m_right_to_left_scale) < 1.23432101234321e+308)) {
      bVar1 = ON_wString::IsNotEmpty(&this->m_scale_as_string);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ON_ScaleValue::IsSet() const
{
  return (
    m_left_length.IsSet()
    && m_right_length.IsSet()
    && (ON_UNSET_VALUE < m_left_to_right_scale && m_left_to_right_scale < ON_UNSET_POSITIVE_VALUE)
    && (ON_UNSET_VALUE < m_right_to_left_scale && m_right_to_left_scale < ON_UNSET_POSITIVE_VALUE)
    && m_scale_as_string.IsNotEmpty()
    );
}